

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

string * __thiscall Unary::toString_abi_cxx11_(string *__return_storage_ptr__,Unary *this)

{
  element_type *peVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Unary *local_18;
  Unary *this_local;
  
  local_18 = this;
  this_local = (Unary *)__return_storage_ptr__;
  peVar1 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_Op).super_Expr.op);
  (**peVar1->_vptr_Token)();
  std::operator+(&local_38,&local_58," ");
  peVar2 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->expr);
  (*(peVar2->super_Node)._vptr_Node[6])(&local_88);
  std::operator+(__return_storage_ptr__,&local_38,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() override {
		return op->toString() + " " + expr->toString();
	}